

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ec_keyx.c
# Opt level: O3

int pkey_gost_encrypt(EVP_PKEY_CTX *pctx,uchar *out,size_t *out_len,uchar *key,size_t key_len)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  EVP_PKEY *pEVar6;
  ASN1_OBJECT *pAVar7;
  gost_cipher_info *pgVar8;
  EVP_PKEY *pEVar9;
  BIGNUM *pBVar10;
  EC_KEY *pEVar11;
  EC_POINT *pEVar12;
  EC_KEY *pEVar13;
  uchar *out_00;
  PSKeyTransport_gost *a;
  ASN1_OCTET_STRING *str;
  EVP_PKEY *pkey;
  GOST_KEY_TRANSPORT *a_00;
  int function;
  EVP_PKEY *local_1140;
  int local_1128;
  int local_1124;
  EVP_PKEY *local_1120;
  gost_cipher_info *local_1118;
  uchar ukm [8];
  uchar *local_1100;
  uchar shared_key [32];
  uchar crypted_key [44];
  gost_ctx cctx;
  
  pvVar5 = EVP_PKEY_CTX_get_data((EVP_PKEY_CTX *)pctx);
  iVar3 = *(int *)((long)pvVar5 + 0x3c);
  if (0x3f4 < iVar3) {
    if ((iVar3 != 0x3f5) && (iVar3 != 0x4a4)) goto LAB_00122a2e;
    crypted_key._0_8_ = out;
    pEVar6 = EVP_PKEY_CTX_get0_pkey((EVP_PKEY_CTX *)pctx);
    pvVar5 = EVP_PKEY_CTX_get_data((EVP_PKEY_CTX *)pctx);
    iVar3 = EVP_PKEY_get_base_id(pEVar6);
    if (*(int *)((long)pvVar5 + 0x3c) == 0x4a4) {
      local_1118 = (gost_cipher_info *)0x4;
      iVar2 = 8;
      local_1128 = 0x4a8;
    }
    else {
      if (*(int *)((long)pvVar5 + 0x3c) != 0x3f5) {
        function = 0x97;
        iVar2 = 0x86;
        iVar3 = 0x1bb;
        goto LAB_00122d5c;
      }
      local_1118 = (gost_cipher_info *)0x8;
      iVar2 = 0x10;
      local_1128 = 0x3f9;
    }
    shared_key._0_4_ = iVar2 + (int)key_len;
    out_00 = (uchar *)CRYPTO_malloc(shared_key._0_4_,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                                    ,0x1c0);
    if (out_00 == (uchar *)0x0) {
      function = 0x97;
      iVar2 = 0xc0100;
      iVar3 = 0x1c2;
      goto LAB_00122d5c;
    }
    pEVar9 = EVP_PKEY_CTX_get0_peerkey((EVP_PKEY_CTX *)pctx);
    pkey = pEVar9;
    if (pEVar9 == (EVP_PKEY *)0x0) {
      pkey = EVP_PKEY_new();
      if (pkey == (EVP_PKEY *)0x0) {
        iVar2 = 0xc0100;
        iVar3 = 0x1cb;
      }
      else {
        iVar2 = EVP_PKEY_get_base_id(pEVar6);
        local_1120 = pEVar9;
        pEVar11 = EC_KEY_new();
        pEVar9 = local_1120;
        iVar2 = EVP_PKEY_assign(pkey,iVar2,pEVar11);
        if ((iVar2 != 0) && (iVar2 = EVP_PKEY_copy_parameters(pkey,pEVar6), iVar2 != 0)) {
          pEVar13 = (EC_KEY *)EVP_PKEY_get0(pkey);
          iVar2 = gost_ec_keygen(pEVar13);
          if (iVar2 != 0) goto LAB_00122b97;
        }
        iVar2 = 0x69;
        iVar3 = 0x1d3;
      }
      ERR_GOST_error(0x97,iVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                     ,iVar3);
      OPENSSL_cleanse(&cctx,0x40);
      iVar3 = 0;
      a = (PSKeyTransport_gost *)0x0;
      goto LAB_00123287;
    }
LAB_00122b97:
    if (*(long *)((long)pvVar5 + 0x30) == 0) {
      iVar2 = RAND_bytes((uchar *)((long)pvVar5 + 0x10),0x20);
      if (0 < iVar2) {
        *(undefined8 *)((long)pvVar5 + 0x30) = 0x20;
        goto LAB_00122bc1;
      }
      ERR_GOST_error(0x97,0xc0103,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                     ,0x1db);
      a = (PSKeyTransport_gost *)0x0;
      iVar3 = 0;
    }
    else {
LAB_00122bc1:
      local_1120 = pEVar9;
      pEVar11 = (EC_KEY *)EVP_PKEY_get0(pEVar6);
      pEVar12 = EC_KEY_get0_public_key(pEVar11);
      pEVar13 = (EC_KEY *)EVP_PKEY_get0(pkey);
      iVar3 = gost_keg((uchar *)((long)pvVar5 + 0x10),iVar3,(EC_POINT *)pEVar12,pEVar13,
                       (uchar *)&cctx);
      if (iVar3 < 1) {
        ERR_GOST_error(0x97,0x87,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                       ,0x1e5);
        a = (PSKeyTransport_gost *)0x0;
        iVar3 = 0;
        pEVar9 = local_1120;
      }
      else {
        iVar3 = gost_kexp15(key,(int)key_len,*(int *)((long)pvVar5 + 0x3c),(uchar *)cctx.key,
                            local_1128,(uchar *)&cctx,(uchar *)((long)pvVar5 + 0x28),
                            (size_t)local_1118,out_00,(int *)shared_key);
        pEVar9 = local_1120;
        if (iVar3 < 1) {
          iVar2 = 0x66;
          iVar3 = 0x1ec;
LAB_0012311a:
          ERR_GOST_error(0x97,iVar2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                         ,iVar3);
          a = (PSKeyTransport_gost *)0x0;
        }
        else {
          a = PSKeyTransport_gost_new();
          if (a == (PSKeyTransport_gost *)0x0) {
            iVar2 = 0xc0100;
            iVar3 = 0x1f2;
            goto LAB_0012311a;
          }
          str = ASN1_OCTET_STRING_new();
          a->ukm = (ASN1_OCTET_STRING *)str;
          if (str == (ASN1_OCTET_STRING *)0x0) {
            iVar2 = 0xc0100;
            iVar3 = 0x1f8;
          }
          else {
            iVar3 = ASN1_OCTET_STRING_set
                              (str,(uchar *)((long)pvVar5 + 0x10),*(int *)((long)pvVar5 + 0x30));
            if (iVar3 == 0) {
              iVar2 = 0xc0100;
              iVar3 = 0x1fd;
            }
            else {
              iVar3 = ASN1_OCTET_STRING_set((ASN1_OCTET_STRING *)a->psexp,out_00,shared_key._0_4_);
              if (iVar3 == 0) {
                iVar2 = 0xc0100;
                iVar3 = 0x202;
              }
              else {
                if (out != (uchar *)0x0) {
                  pEVar6 = pkey;
                }
                iVar3 = X509_PUBKEY_set((X509_PUBKEY **)&a->ephem_key,pEVar6);
                if (iVar3 != 0) {
                  iVar3 = 0;
                  uVar4 = i2d_PSKeyTransport_gost(a,(uchar **)0x0);
                  if ((int)uVar4 < 1) {
                    ERR_GOST_error(0x97,0x8000d,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                                   ,0x20d);
                  }
                  else {
                    if (out != (uchar *)0x0) {
                      if (*out_len < (ulong)uVar4) {
                        iVar2 = 0x8c;
                        iVar3 = 0x216;
                      }
                      else {
                        iVar2 = i2d_PSKeyTransport_gost(a,(uchar **)crypted_key);
                        *out_len = (long)iVar2;
                        iVar3 = 1;
                        if (iVar2 != 0) goto LAB_00123266;
                        iVar2 = 0x8000d;
                        iVar3 = 0x21c;
                      }
                      goto LAB_0012325f;
                    }
                    *out_len = (ulong)uVar4;
                    iVar3 = 1;
                  }
                  goto LAB_00123266;
                }
                iVar2 = 0x66;
                iVar3 = 0x207;
              }
            }
          }
LAB_0012325f:
          ERR_GOST_error(0x97,iVar2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                         ,iVar3);
        }
        iVar3 = 0;
      }
    }
LAB_00123266:
    OPENSSL_cleanse(&cctx,0x40);
    if (pEVar9 == (EVP_PKEY *)0x0) {
      EVP_PKEY_free(pkey);
    }
LAB_00123287:
    PSKeyTransport_gost_free(a);
    CRYPTO_free(out_00);
    return iVar3;
  }
  if ((iVar3 != 0) && (iVar3 != 0x32d)) {
LAB_00122a2e:
    function = 0x98;
    iVar2 = 0xc0103;
    iVar3 = 0x238;
LAB_00122d5c:
    ERR_GOST_error(function,iVar2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                   ,iVar3);
    return -1;
  }
  local_1100 = out;
  pEVar6 = EVP_PKEY_CTX_get0_pkey((EVP_PKEY_CTX *)pctx);
  pvVar5 = EVP_PKEY_CTX_get_data((EVP_PKEY_CTX *)pctx);
  iVar2 = EVP_PKEY_get_base_id(pEVar6);
  iVar3 = 0x3eb;
  if (iVar2 == 0x32b) {
    iVar3 = 0x338;
  }
  if (iVar2 == 0x331) {
    iVar3 = 0x338;
  }
  pAVar7 = OBJ_nid2obj(iVar3);
  pgVar8 = get_encryption_params((ASN1_OBJECT *)pAVar7);
  pEVar9 = EVP_PKEY_CTX_get0_peerkey((EVP_PKEY_CTX *)pctx);
  if (*(long *)((long)pvVar5 + 0x30) == 0) {
    iVar3 = RAND_bytes(ukm,8);
    if (iVar3 < 1) {
      ERR_GOST_error(0x7c,0x7e,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                     ,0x12d);
      return 0;
    }
  }
  else {
    ukm = *(uchar (*) [8])((long)pvVar5 + 0x10);
  }
  if (pgVar8 == (gost_cipher_info *)0x0) {
    a_00 = (GOST_KEY_TRANSPORT *)0x0;
LAB_00122eeb:
    OPENSSL_cleanse(shared_key,0x20);
  }
  else {
    if (pEVar9 == (EVP_PKEY *)0x0) {
      if (out == (uchar *)0x0) {
        bVar1 = true;
        local_1140 = (EVP_PKEY *)0x0;
        goto LAB_00122f3f;
      }
      local_1118 = pgVar8;
      local_1140 = EVP_PKEY_new();
      iVar3 = EVP_PKEY_get_base_id(pEVar6);
      pEVar11 = EC_KEY_new();
      iVar3 = EVP_PKEY_assign(local_1140,iVar3,pEVar11);
      if ((iVar3 != 0) && (iVar3 = EVP_PKEY_copy_parameters(local_1140,pEVar6), iVar3 != 0)) {
        pEVar13 = (EC_KEY *)EVP_PKEY_get0(local_1140);
        iVar3 = gost_ec_keygen(pEVar13);
        if (iVar3 != 0) {
          bVar1 = true;
          pgVar8 = local_1118;
          goto LAB_00122a99;
        }
      }
      ERR_GOST_error(0x7c,0x69,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                     ,0x143);
      a_00 = (GOST_KEY_TRANSPORT *)0x0;
      pEVar9 = local_1140;
      goto LAB_00122eeb;
    }
    pBVar10 = gost_get0_priv_key((EVP_PKEY *)pEVar9);
    if (pBVar10 == (BIGNUM *)0x0) {
      ERR_GOST_error(0x7c,0x7c,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                     ,0x138);
      a_00 = (GOST_KEY_TRANSPORT *)0x0;
LAB_00122eb4:
      OPENSSL_cleanse(shared_key,0x20);
      goto LAB_00123065;
    }
    bVar1 = false;
    local_1140 = pEVar9;
    if (out == (uchar *)0x0) {
LAB_00122f3f:
      a_00 = GOST_KEY_TRANSPORT_new();
      if (a_00 == (GOST_KEY_TRANSPORT *)0x0) goto LAB_0012303f;
      iVar3 = ASN1_OCTET_STRING_set((ASN1_OCTET_STRING *)a_00->key_agreement_info->eph_iv,ukm,8);
      if (((iVar3 != 0) &&
          (iVar3 = ASN1_OCTET_STRING_set
                             ((ASN1_OCTET_STRING *)a_00->key_info->imit,crypted_key + 0x28,4),
          iVar3 != 0)) &&
         (iVar3 = ASN1_OCTET_STRING_set
                            ((ASN1_OCTET_STRING *)a_00->key_info->encrypted_key,crypted_key + 8,0x20
                            ), iVar3 != 0)) {
        if (pEVar9 == (EVP_PKEY *)0x0) {
          if (out != (uchar *)0x0) {
            pEVar6 = local_1140;
          }
          iVar3 = X509_PUBKEY_set((X509_PUBKEY **)&a_00->key_agreement_info->ephem_key,pEVar6);
          if (iVar3 == 0) {
            ERR_GOST_error(0x7c,0x66,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                           ,0x16a);
            pEVar9 = local_1140;
            goto LAB_00122eeb;
          }
          ASN1_OBJECT_free((ASN1_OBJECT *)a_00->key_agreement_info->cipher);
          pAVar7 = OBJ_nid2obj(pgVar8->nid);
          a_00->key_agreement_info->cipher = (ASN1_OBJECT *)pAVar7;
          EVP_PKEY_free(local_1140);
        }
        else {
          ASN1_OBJECT_free((ASN1_OBJECT *)a_00->key_agreement_info->cipher);
          pAVar7 = OBJ_nid2obj(pgVar8->nid);
          a_00->key_agreement_info->cipher = (ASN1_OBJECT *)pAVar7;
          iVar3 = EVP_PKEY_CTX_ctrl((EVP_PKEY_CTX *)pctx,-1,-1,2,3,(void *)0x0);
          if (iVar3 < 1) {
            ERR_GOST_error(0x7c,0x68,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                           ,0x176);
            goto LAB_00122eb4;
          }
        }
        uVar4 = i2d_GOST_KEY_TRANSPORT(a_00,(uchar **)0x0);
        if ((int)uVar4 < 1) {
          iVar2 = 0x8000d;
          iVar3 = 0x17c;
        }
        else {
          if (local_1100 == (uchar *)0x0) {
            *out_len = (ulong)uVar4;
            iVar3 = 1;
LAB_001232e0:
            OPENSSL_cleanse(shared_key,0x20);
            GOST_KEY_TRANSPORT_free(a_00);
            return iVar3;
          }
          if ((ulong)uVar4 <= *out_len) {
            iVar2 = i2d_GOST_KEY_TRANSPORT(a_00,&local_1100);
            *out_len = (long)iVar2;
            iVar3 = 1;
            if (iVar2 == 0) {
              ERR_GOST_error(0x7c,0x8000d,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                             ,0x18b);
              iVar3 = 0;
            }
            goto LAB_001232e0;
          }
          iVar2 = 0x8c;
          iVar3 = 0x185;
        }
        ERR_GOST_error(0x7c,iVar2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                       ,iVar3);
      }
    }
    else {
LAB_00122a99:
      local_1124 = 0;
      EVP_PKEY_get_default_digest_nid(pEVar6,&local_1124);
      if (local_1124 == 0x3d7) {
        local_1124 = 0x3d6;
      }
      pEVar11 = (EC_KEY *)EVP_PKEY_get0(pEVar6);
      pEVar12 = EC_KEY_get0_public_key(pEVar11);
      pEVar13 = (EC_KEY *)EVP_PKEY_get0(local_1140);
      iVar3 = VKO_compute_key(shared_key,(EC_POINT *)pEVar12,pEVar13,ukm,8,local_1124);
      if (iVar3 != 0) {
        gost_init(&cctx,pgVar8->sblock);
        keyWrapCryptoPro(&cctx,shared_key,ukm,key,crypted_key);
        goto LAB_00122f3f;
      }
      ERR_GOST_error(0x7c,0x69,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                     ,0x152);
LAB_0012303f:
      a_00 = (GOST_KEY_TRANSPORT *)0x0;
    }
    OPENSSL_cleanse(shared_key,0x20);
    pEVar9 = local_1140;
    if (!bVar1) goto LAB_00123065;
  }
  EVP_PKEY_free(pEVar9);
LAB_00123065:
  GOST_KEY_TRANSPORT_free(a_00);
  return -1;
}

Assistant:

int pkey_gost_encrypt(EVP_PKEY_CTX *pctx, unsigned char *out,
                      size_t *out_len, const unsigned char *key, size_t key_len)
{
  struct gost_pmeth_data *gctx = EVP_PKEY_CTX_get_data(pctx);
  switch (gctx->cipher_nid)
  {
    case NID_id_Gost28147_89:
    case NID_undef: /* FIXME */
      return pkey_GOST_ECcp_encrypt(pctx, out, out_len, key, key_len);
      break;
    case NID_kuznyechik_ctr:
    case NID_magma_ctr:
      return pkey_gost2018_encrypt(pctx, out, out_len, key, key_len);
      break;
    default:
      GOSTerr(GOST_F_PKEY_GOST_ENCRYPT, ERR_R_INTERNAL_ERROR);
      return -1;
  }
}